

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_sbit_decoder_load_image
                   (TT_SBitDecoder decoder,FT_UInt glyph_index,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count,FT_Bool metrics_only)

{
  FT_Byte *pFVar1;
  FT_Byte FVar2;
  ushort uVar3;
  uint uVar4;
  ushort *limit;
  uint uVar5;
  FT_Error FVar6;
  ulong uVar7;
  ushort *puVar8;
  byte *pbVar9;
  undefined1 *puVar10;
  ulong uVar11;
  FT_Byte *pFVar12;
  FT_UInt gindex_1;
  FT_ULong num_glyphs_1;
  FT_ULong mm_1;
  FT_ULong image_size_1;
  FT_UInt gindex;
  FT_ULong num_glyphs;
  FT_ULong mm;
  FT_ULong image_size;
  FT_ULong image_offset;
  FT_ULong image_end;
  FT_ULong image_start;
  FT_UInt image_format;
  FT_UInt index_format;
  FT_UInt end;
  FT_UInt start;
  FT_ULong num_ranges;
  FT_Byte *p_limit;
  FT_Byte *p;
  FT_UInt local_28;
  FT_Int FStack_24;
  FT_Bool metrics_only_local;
  FT_UInt recurse_count_local;
  FT_Int y_pos_local;
  FT_Int x_pos_local;
  FT_UInt glyph_index_local;
  TT_SBitDecoder decoder_local;
  
  p_limit = decoder->eblc_base + decoder->strike_index_array;
  limit = (ushort *)decoder->eblc_limit;
  _end = decoder->strike_index_count;
  image_end = 0;
  image_offset = 0;
  if (100 < recurse_count) {
    return 8;
  }
LAB_00333d2f:
  local_28 = recurse_count;
  if (_end != 0) {
    uVar5 = (uint)CONCAT11(*p_limit,p_limit[1]);
    if ((glyph_index < uVar5) || (CONCAT11(p_limit[2],p_limit[3]) < glyph_index)) goto LAB_00333dac;
    uVar7 = (ulong)((uint)p_limit[4] << 0x18 | (uint)p_limit[5] << 0x10 | (uint)p_limit[6] << 8 |
                   (uint)p_limit[7]);
    if ((ulong)((long)limit - (long)(decoder->eblc_base + decoder->strike_index_array)) < uVar7) {
      return 8;
    }
    puVar8 = (ushort *)(decoder->eblc_base + decoder->strike_index_array + uVar7);
    if (puVar8 + 4 <= limit) {
      uVar3 = puVar8[1];
      uVar4 = *(uint *)(puVar8 + 2);
      p._7_1_ = metrics_only;
      FStack_24 = y_pos;
      recurse_count_local = x_pos;
      y_pos_local = glyph_index;
      _x_pos_local = decoder;
      switch(*puVar8 << 8 | *puVar8 >> 8) {
      case 1:
        pbVar9 = (byte *)((long)puVar8 + (ulong)((glyph_index - uVar5) * 4) + 8);
        if (pbVar9 + 8 <= limit) {
          image_end = (FT_ULong)
                      ((uint)*pbVar9 << 0x18 | (uint)pbVar9[1] << 0x10 | (uint)pbVar9[2] << 8 |
                      (uint)pbVar9[3]);
          p_limit = pbVar9 + 8;
          image_offset = (FT_ULong)
                         ((uint)pbVar9[4] << 0x18 | (uint)pbVar9[5] << 0x10 | (uint)pbVar9[6] << 8 |
                         (uint)pbVar9[7]);
          if (image_end != image_offset) goto LAB_003343da;
        }
        break;
      case 2:
        if (puVar8 + 10 <= limit) {
          p_limit = (FT_Byte *)(puVar8 + 6);
          uVar7 = (ulong)((uint)(byte)puVar8[4] << 0x18 | (uint)*(byte *)((long)puVar8 + 9) << 0x10
                          | (uint)(byte)puVar8[5] << 8 | (uint)*(byte *)((long)puVar8 + 0xb));
          FVar6 = tt_sbit_decoder_load_metrics(decoder,&p_limit,(FT_Byte *)limit,'\x01');
          if (FVar6 == 0) {
            image_end = uVar7 * (y_pos_local - uVar5);
            image_offset = image_end + uVar7;
            goto LAB_003343da;
          }
        }
        break;
      case 3:
        puVar10 = (undefined1 *)((long)puVar8 + (ulong)((glyph_index - uVar5) * 2) + 8);
        if (puVar10 + 4 <= limit) {
          image_end = (FT_ULong)CONCAT11(*puVar10,puVar10[1]);
          p_limit = puVar10 + 4;
          image_offset = (FT_ULong)CONCAT11(puVar10[2],puVar10[3]);
          if (image_end != image_offset) goto LAB_003343da;
        }
        break;
      case 4:
        if (puVar8 + 6 <= limit) {
          p_limit = (FT_Byte *)(puVar8 + 6);
          uVar7 = (ulong)((uint)(byte)puVar8[4] << 0x18 | (uint)*(byte *)((long)puVar8 + 9) << 0x10
                          | (uint)(byte)puVar8[5] << 8 | (uint)*(byte *)((long)puVar8 + 0xb));
          if ((puVar8 + 8 <= limit) && (uVar7 <= ((long)limit - (long)p_limit >> 2) - 1U)) {
            num_glyphs = 0;
            goto LAB_0033416e;
          }
        }
        break;
      case 5:
      case 0x13:
        if (puVar8 + 0xc <= limit) {
          p_limit = (FT_Byte *)(puVar8 + 6);
          uVar7 = (ulong)((uint)(byte)puVar8[4] << 0x18 | (uint)*(byte *)((long)puVar8 + 9) << 0x10
                          | (uint)(byte)puVar8[5] << 8 | (uint)*(byte *)((long)puVar8 + 0xb));
          FVar6 = tt_sbit_decoder_load_metrics(decoder,&p_limit,(FT_Byte *)limit,'\x01');
          if (FVar6 == 0) {
            uVar11 = (ulong)((uint)*p_limit << 0x18 | (uint)p_limit[1] << 0x10 |
                             (uint)p_limit[2] << 8 | (uint)p_limit[3]);
            if (uVar11 <= (ulong)((long)limit - (long)(p_limit + 4) >> 1)) {
              num_glyphs_1 = 0;
              p_limit = p_limit + 4;
              while ((num_glyphs_1 < uVar11 &&
                     (pFVar12 = p_limit + 2, FVar2 = *p_limit, pFVar1 = p_limit + 1,
                     p_limit = pFVar12, (uint)CONCAT11(FVar2,*pFVar1) != y_pos_local))) {
                num_glyphs_1 = num_glyphs_1 + 1;
              }
              if (uVar11 <= num_glyphs_1) break;
              image_end = uVar7 * num_glyphs_1;
              image_offset = image_end + uVar7;
              goto LAB_003343da;
            }
          }
        }
        break;
      default:
      }
    }
  }
  goto LAB_0033443b;
LAB_00333dac:
  p_limit = p_limit + 8;
  _end = _end - 1;
  goto LAB_00333d2f;
LAB_0033416e:
  if (uVar7 <= num_glyphs) {
LAB_0033423a:
    if (num_glyphs < uVar7) {
LAB_003343da:
      if (image_end <= image_offset) {
        FVar6 = tt_sbit_decoder_load_bitmap
                          (_x_pos_local,(uint)(ushort)(uVar3 << 8 | uVar3 >> 8),
                           (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                           uVar4 << 0x18) + image_end,image_offset - image_end,recurse_count_local,
                           FStack_24,local_28,p._7_1_);
        return FVar6;
      }
    }
LAB_0033443b:
    if (local_28 == 0) {
      return 0x9d;
    }
    return 0x15;
  }
  if (CONCAT11(*p_limit,p_limit[1]) == glyph_index) {
    image_end = (FT_ULong)CONCAT11(p_limit[2],p_limit[3]);
    image_offset = (FT_ULong)CONCAT11(p_limit[6],p_limit[7]);
    p_limit = p_limit + 6;
    goto LAB_0033423a;
  }
  p_limit = p_limit + 4;
  num_glyphs = num_glyphs + 1;
  goto LAB_0033416e;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_image( TT_SBitDecoder  decoder,
                              FT_UInt         glyph_index,
                              FT_Int          x_pos,
                              FT_Int          y_pos,
                              FT_UInt         recurse_count,
                              FT_Bool         metrics_only )
  {
    FT_Byte*  p          = decoder->eblc_base + decoder->strike_index_array;
    FT_Byte*  p_limit    = decoder->eblc_limit;
    FT_ULong  num_ranges = decoder->strike_index_count;
    FT_UInt   start, end, index_format, image_format;
    FT_ULong  image_start = 0, image_end = 0, image_offset;


    /* arbitrary recursion limit */
    if ( recurse_count > 100 )
    {
      FT_TRACE4(( "tt_sbit_decoder_load_image:"
                  " recursion depth exceeded\n" ));
      goto Failure;
    }


    /* First, we find the correct strike range that applies to this */
    /* glyph index.                                                 */
    for ( ; num_ranges > 0; num_ranges-- )
    {
      start = FT_NEXT_USHORT( p );
      end   = FT_NEXT_USHORT( p );

      if ( glyph_index >= start && glyph_index <= end )
        goto FoundRange;

      p += 4;  /* ignore index offset */
    }
    goto NoBitmap;

  FoundRange:
    image_offset = FT_NEXT_ULONG( p );

    /* overflow check */
    p = decoder->eblc_base + decoder->strike_index_array;
    if ( image_offset > (FT_ULong)( p_limit - p ) )
      goto Failure;

    p += image_offset;
    if ( p + 8 > p_limit )
      goto NoBitmap;

    /* now find the glyph's location and extend within the ebdt table */
    index_format = FT_NEXT_USHORT( p );
    image_format = FT_NEXT_USHORT( p );
    image_offset = FT_NEXT_ULONG ( p );

    switch ( index_format )
    {
    case 1: /* 4-byte offsets relative to `image_offset' */
      p += 4 * ( glyph_index - start );
      if ( p + 8 > p_limit )
        goto NoBitmap;

      image_start = FT_NEXT_ULONG( p );
      image_end   = FT_NEXT_ULONG( p );

      if ( image_start == image_end )  /* missing glyph */
        goto NoBitmap;
      break;

    case 2: /* big metrics, constant image size */
      {
        FT_ULong  image_size;


        if ( p + 12 > p_limit )
          goto NoBitmap;

        image_size = FT_NEXT_ULONG( p );

        if ( tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 1 ) )
          goto NoBitmap;

        image_start = image_size * ( glyph_index - start );
        image_end   = image_start + image_size;
      }
      break;

    case 3: /* 2-byte offsets relative to 'image_offset' */
      p += 2 * ( glyph_index - start );
      if ( p + 4 > p_limit )
        goto NoBitmap;

      image_start = FT_NEXT_USHORT( p );
      image_end   = FT_NEXT_USHORT( p );

      if ( image_start == image_end )  /* missing glyph */
        goto NoBitmap;
      break;

    case 4: /* sparse glyph array with (glyph,offset) pairs */
      {
        FT_ULong  mm, num_glyphs;


        if ( p + 4 > p_limit )
          goto NoBitmap;

        num_glyphs = FT_NEXT_ULONG( p );

        /* overflow check for p + ( num_glyphs + 1 ) * 4 */
        if ( p + 4 > p_limit                                         ||
             num_glyphs > (FT_ULong)( ( ( p_limit - p ) >> 2 ) - 1 ) )
          goto NoBitmap;

        for ( mm = 0; mm < num_glyphs; mm++ )
        {
          FT_UInt  gindex = FT_NEXT_USHORT( p );


          if ( gindex == glyph_index )
          {
            image_start = FT_NEXT_USHORT( p );
            p          += 2;
            image_end   = FT_PEEK_USHORT( p );
            break;
          }
          p += 2;
        }

        if ( mm >= num_glyphs )
          goto NoBitmap;
      }
      break;

    case 5: /* constant metrics with sparse glyph codes */
    case 19:
      {
        FT_ULong  image_size, mm, num_glyphs;


        if ( p + 16 > p_limit )
          goto NoBitmap;

        image_size = FT_NEXT_ULONG( p );

        if ( tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 1 ) )
          goto NoBitmap;

        num_glyphs = FT_NEXT_ULONG( p );

        /* overflow check for p + 2 * num_glyphs */
        if ( num_glyphs > (FT_ULong)( ( p_limit - p ) >> 1 ) )
          goto NoBitmap;

        for ( mm = 0; mm < num_glyphs; mm++ )
        {
          FT_UInt  gindex = FT_NEXT_USHORT( p );


          if ( gindex == glyph_index )
            break;
        }

        if ( mm >= num_glyphs )
          goto NoBitmap;

        image_start = image_size * mm;
        image_end   = image_start + image_size;
      }
      break;

    default:
      goto NoBitmap;
    }

    if ( image_start > image_end )
      goto NoBitmap;

    image_end  -= image_start;
    image_start = image_offset + image_start;

    FT_TRACE3(( "tt_sbit_decoder_load_image:"
                " found sbit (format %d) for glyph index %d\n",
                image_format, glyph_index ));

    return tt_sbit_decoder_load_bitmap( decoder,
                                        image_format,
                                        image_start,
                                        image_end,
                                        x_pos,
                                        y_pos,
                                        recurse_count,
                                        metrics_only );

  Failure:
    return FT_THROW( Invalid_Table );

  NoBitmap:
    if ( recurse_count )
    {
      FT_TRACE4(( "tt_sbit_decoder_load_image:"
                  " missing subglyph sbit with glyph index %d\n",
                  glyph_index ));
      return FT_THROW( Invalid_Composite );
    }

    FT_TRACE4(( "tt_sbit_decoder_load_image:"
                " no sbit found for glyph index %d\n", glyph_index ));
    return FT_THROW( Missing_Bitmap );
  }